

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess_unix.cpp
# Opt level: O0

bool __thiscall QProcessPrivate::openChannel(QProcessPrivate *this,Channel *channel)

{
  QUtf8StringView fnName;
  QUtf8StringView fnName_00;
  bool bVar1;
  int iVar2;
  void *pvVar3;
  undefined1 *puVar4;
  undefined1 *in_RSI;
  QProcessPrivate *in_RDI;
  long in_FS_OFFSET;
  Channel *sink;
  Channel *source;
  int mode;
  char *receiver;
  QProcess *q;
  QByteArray fname;
  Q_PIPE pipe [2];
  mode_t in_stack_fffffffffffffe98;
  int in_stack_fffffffffffffe9c;
  QString *in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea8;
  ProcessError in_stack_fffffffffffffeac;
  QProcessPrivate *in_stack_fffffffffffffeb0;
  QProcessPrivate *this_00;
  undefined4 in_stack_fffffffffffffeb8;
  int in_stack_fffffffffffffebc;
  QObject *in_stack_fffffffffffffec0;
  Type in_stack_fffffffffffffecc;
  QSocketNotifier *in_stack_fffffffffffffed0;
  undefined1 *local_108;
  undefined8 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  bool local_b9;
  QBindingStatus *local_60;
  ExtraData *local_58;
  AtomicType local_50;
  undefined4 local_10;
  undefined4 uStack_c;
  QByteArray *local_8;
  
  local_8 = *(QByteArray **)(in_FS_OFFSET + 0x28);
  q_func(in_RDI);
  if (in_RSI[0x30] == '\0') {
    iVar2 = qt_create_pipe((int *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    if (iVar2 == 0) {
      QBasicAtomicPointer<QThreadData>::loadRelaxed((QBasicAtomicPointer<QThreadData> *)0x7a07c5);
      bVar1 = QThreadData::hasEventDispatcher((QThreadData *)0x7a07cd);
      if (bVar1) {
        if ((Channel *)in_RSI == &in_RDI->stdinChannel) {
          pvVar3 = operator_new(0x10);
          QSocketNotifier::QSocketNotifier
                    (in_stack_fffffffffffffed0,in_stack_fffffffffffffecc,in_stack_fffffffffffffec0);
          *(void **)(in_RSI + 0x20) = pvVar3;
          QSocketNotifier::setSocket
                    ((QSocketNotifier *)in_stack_fffffffffffffeb0,
                     CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
          QObject::connect((int)&stack0xffffffffffffffc0,*(sockaddr **)(in_RSI + 0x20),0xa0deab);
          QMetaObject::Connection::~Connection((Connection *)in_stack_fffffffffffffea0);
        }
        else {
          pvVar3 = operator_new(0x10);
          QSocketNotifier::QSocketNotifier
                    (in_stack_fffffffffffffed0,in_stack_fffffffffffffecc,in_stack_fffffffffffffec0);
          *(void **)(in_RSI + 0x20) = pvVar3;
          QSocketNotifier::setSocket
                    ((QSocketNotifier *)in_stack_fffffffffffffeb0,
                     CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
          QObject::connect((int)&stack0xffffffffffffffb8,*(sockaddr **)(in_RSI + 0x20),0xa0deab);
          QMetaObject::Connection::~Connection((Connection *)in_stack_fffffffffffffea0);
        }
      }
      local_b9 = true;
    }
    else {
      QBasicUtf8StringView<false>::QBasicUtf8StringView<char[5],_true>
                ((QBasicUtf8StringView<false> *)in_stack_fffffffffffffeb0,
                 (char (*) [5])CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
      fnName.m_size._0_4_ = in_stack_ffffffffffffff08;
      fnName.m_data = (storage_type *)in_stack_ffffffffffffff00;
      fnName.m_size._4_4_ = in_stack_ffffffffffffff0c;
      anon_unknown.dwarf_1185e52::errorMessageForSyscall(fnName,in_stack_fffffffffffffebc);
      setErrorAndEmit(in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac,in_stack_fffffffffffffea0)
      ;
      QString::~QString((QString *)0x7a0780);
      local_b9 = false;
    }
    goto LAB_007a0dd3;
  }
  if (in_RSI[0x30] != '\x03') {
    if (in_RSI[0x30] == '\x01') {
      local_108 = (undefined1 *)(*(long *)(in_RSI + 0x18) + 0x188);
      puVar4 = in_RSI;
    }
    else {
      puVar4 = (undefined1 *)(*(long *)(in_RSI + 0x18) + 0x1c0);
      local_108 = in_RSI;
    }
    if ((*(int *)(puVar4 + 0x2c) == -1) && (*(int *)(local_108 + 0x28) == -1)) {
      _local_10 = (QRingBuffer *)0xffffffffffffffff;
      iVar2 = qt_create_pipe((int *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
      if (iVar2 == 0) {
        *(undefined4 *)(local_108 + 0x28) = local_10;
        *(undefined4 *)(puVar4 + 0x2c) = uStack_c;
        local_b9 = true;
      }
      else {
        QBasicUtf8StringView<false>::QBasicUtf8StringView<char[5],_true>
                  ((QBasicUtf8StringView<false> *)in_stack_fffffffffffffeb0,
                   (char (*) [5])CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
        this_00 = (QProcessPrivate *)&stack0xffffffffffffff58;
        fnName_00.m_size._0_4_ = in_stack_ffffffffffffff08;
        fnName_00.m_data = puVar4;
        fnName_00.m_size._4_4_ = in_stack_ffffffffffffff0c;
        anon_unknown.dwarf_1185e52::errorMessageForSyscall(fnName_00,in_stack_fffffffffffffebc);
        setErrorAndEmit(this_00,in_stack_fffffffffffffeac,in_stack_fffffffffffffea0);
        QString::~QString((QString *)0x7a0d7c);
        local_b9 = false;
      }
    }
    else {
      local_b9 = true;
    }
    goto LAB_007a0dd3;
  }
  local_60 = (QBindingStatus *)&DAT_aaaaaaaaaaaaaaaa;
  local_58 = (ExtraData *)&DAT_aaaaaaaaaaaaaaaa;
  local_50._M_b._M_p = (__base_type)&DAT_aaaaaaaaaaaaaaaa;
  QFile::encodeName((QString *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
  if ((Channel *)in_RSI == &in_RDI->stdinChannel) {
    *(undefined4 *)(in_RSI + 0x2c) = 0xffffffff;
    QByteArray::operator_cast_to_char_((QByteArray *)0x7a0a58);
    iVar2 = qt_safe_open((char *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c,
                         in_stack_fffffffffffffe98);
    *(int *)(in_RSI + 0x28) = iVar2;
    if (iVar2 == -1) {
      QProcess::tr((char *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                   (char *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c);
      setErrorAndEmit(in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac,in_stack_fffffffffffffea0)
      ;
      QString::~QString((QString *)0x7a0afe);
LAB_007a0c2c:
      local_b9 = false;
    }
    else {
      local_b9 = true;
    }
  }
  else {
    *(undefined4 *)(in_RSI + 0x28) = 0xffffffff;
    QByteArray::operator_cast_to_char_((QByteArray *)0x7a0b7b);
    iVar2 = qt_safe_open((char *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c,
                         in_stack_fffffffffffffe98);
    *(int *)(in_RSI + 0x2c) = iVar2;
    if (iVar2 == -1) {
      QProcess::tr((char *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                   (char *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c);
      setErrorAndEmit(in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac,in_stack_fffffffffffffea0)
      ;
      QString::~QString((QString *)0x7a0c03);
      goto LAB_007a0c2c;
    }
    local_b9 = true;
  }
  QByteArray::~QByteArray((QByteArray *)0x7a0c49);
LAB_007a0dd3:
  if (*(QByteArray **)(in_FS_OFFSET + 0x28) == local_8) {
    return local_b9;
  }
  __stack_chk_fail();
}

Assistant:

bool QProcessPrivate::openChannel(Channel &channel)
{
    Q_Q(QProcess);

    if (channel.type == Channel::Normal) {
        // we're piping this channel to our own process
        if (qt_create_pipe(channel.pipe) != 0) {
            setErrorAndEmit(QProcess::FailedToStart, errorMessageForSyscall("pipe"));
            return false;
        }

        // create the socket notifiers
        if (threadData.loadRelaxed()->hasEventDispatcher()) {
            if (&channel == &stdinChannel) {
                channel.notifier = new QSocketNotifier(QSocketNotifier::Write, q);
                channel.notifier->setSocket(channel.pipe[1]);
                QObject::connect(channel.notifier, SIGNAL(activated(QSocketDescriptor)),
                                 q, SLOT(_q_canWrite()));
            } else {
                channel.notifier = new QSocketNotifier(QSocketNotifier::Read, q);
                channel.notifier->setSocket(channel.pipe[0]);
                const char *receiver;
                if (&channel == &stdoutChannel)
                    receiver = SLOT(_q_canReadStandardOutput());
                else
                    receiver = SLOT(_q_canReadStandardError());
                QObject::connect(channel.notifier, SIGNAL(activated(QSocketDescriptor)),
                                 q, receiver);
            }
        }

        return true;
    } else if (channel.type == Channel::Redirect) {
        // we're redirecting the channel to/from a file
        QByteArray fname = QFile::encodeName(channel.file);

        if (&channel == &stdinChannel) {
            // try to open in read-only mode
            channel.pipe[1] = -1;
            if ( (channel.pipe[0] = qt_safe_open(fname, O_RDONLY)) != -1)
                return true;    // success
            setErrorAndEmit(QProcess::FailedToStart,
                            QProcess::tr("Could not open input redirection for reading"));
        } else {
            int mode = O_WRONLY | O_CREAT;
            if (channel.append)
                mode |= O_APPEND;
            else
                mode |= O_TRUNC;

            channel.pipe[0] = -1;
            if ( (channel.pipe[1] = qt_safe_open(fname, mode, 0666)) != -1)
                return true; // success

            setErrorAndEmit(QProcess::FailedToStart,
                            QProcess::tr("Could not open input redirection for reading"));
        }
        return false;
    } else {
        Q_ASSERT_X(channel.process, "QProcess::start", "Internal error");

        Channel *source;
        Channel *sink;

        if (channel.type == Channel::PipeSource) {
            // we are the source
            source = &channel;
            sink = &channel.process->stdinChannel;

            Q_ASSERT(source == &stdoutChannel);
            Q_ASSERT(sink->process == this && sink->type == Channel::PipeSink);
        } else {
            // we are the sink;
            source = &channel.process->stdoutChannel;
            sink = &channel;

            Q_ASSERT(sink == &stdinChannel);
            Q_ASSERT(source->process == this && source->type == Channel::PipeSource);
        }

        if (source->pipe[1] != INVALID_Q_PIPE || sink->pipe[0] != INVALID_Q_PIPE) {
            // already created, do nothing
            return true;
        } else {
            Q_ASSERT(source->pipe[0] == INVALID_Q_PIPE && source->pipe[1] == INVALID_Q_PIPE);
            Q_ASSERT(sink->pipe[0] == INVALID_Q_PIPE && sink->pipe[1] == INVALID_Q_PIPE);

            Q_PIPE pipe[2] = { -1, -1 };
            if (qt_create_pipe(pipe) != 0) {
                setErrorAndEmit(QProcess::FailedToStart, errorMessageForSyscall("pipe"));
                return false;
            }
            sink->pipe[0] = pipe[0];
            source->pipe[1] = pipe[1];

            return true;
        }
    }
}